

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1e8ba::CpuTest_nop0c_abs_Test::TestBody(CpuTest_nop0c_abs_Test *this)

{
  ushort uVar1;
  code *pcVar2;
  bool bVar3;
  MockSpec<unsigned_char_(unsigned_short)> *pMVar4;
  TypedExpectation<unsigned_char_(unsigned_short)> *pTVar5;
  char *message;
  AssertHelper local_118;
  Message local_110;
  undefined1 local_108 [8];
  AssertionResult gtest_ar;
  Action<unsigned_char_(unsigned_short)> local_e8;
  WithoutMatchers local_c1;
  Matcher<unsigned_short> local_c0;
  MockSpec<unsigned_char_(unsigned_short)> local_a8;
  ReturnAction<int> local_88;
  Action<unsigned_char_(unsigned_short)> local_78;
  WithoutMatchers local_55 [13];
  Matcher<unsigned_short> local_48;
  MockSpec<unsigned_char_(unsigned_short)> local_30;
  CpuTest_nop0c_abs_Test *local_10;
  CpuTest_nop0c_abs_Test *this_local;
  
  local_10 = this;
  n_e_s::core::test::CpuTest::stage_instruction(&this->super_CpuTest,'\f');
  uVar1 = (this->super_CpuTest).expected.pc;
  if (SCARRY4((uint)uVar1,2)) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  (this->super_CpuTest).expected.pc = uVar1 + 2;
  uVar1 = (this->super_CpuTest).registers.pc;
  if (!SCARRY4((uint)uVar1,1)) {
    testing::Matcher<unsigned_short>::Matcher(&local_48,uVar1 + 1);
    n_e_s::core::test::MockMmu::gmock_read_byte
              (&local_30,&(this->super_CpuTest).mmu.super_MockMmu,&local_48);
    testing::internal::GetWithoutMatchers();
    pMVar4 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                       (&local_30,local_55,(void *)0x0);
    pTVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                       (pMVar4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                        ,0x244,"mmu","read_byte(registers.pc + 1)");
    testing::Return<int>((testing *)&local_88,0xcd);
    testing::internal::ReturnAction::operator_cast_to_Action(&local_78,(ReturnAction *)&local_88);
    testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar5,&local_78);
    testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_78);
    testing::internal::ReturnAction<int>::~ReturnAction(&local_88);
    testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_30);
    testing::Matcher<unsigned_short>::~Matcher(&local_48);
    uVar1 = (this->super_CpuTest).registers.pc;
    if (!SCARRY4((uint)uVar1,2)) {
      testing::Matcher<unsigned_short>::Matcher(&local_c0,uVar1 + 2);
      n_e_s::core::test::MockMmu::gmock_read_byte
                (&local_a8,&(this->super_CpuTest).mmu.super_MockMmu,&local_c0);
      testing::internal::GetWithoutMatchers();
      pMVar4 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                         (&local_a8,&local_c1,(void *)0x0);
      pTVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                         (pMVar4,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                          ,0x245,"mmu","read_byte(registers.pc + 2)");
      testing::Return<int>((testing *)&gtest_ar.message_,0xef);
      testing::internal::ReturnAction::operator_cast_to_Action
                (&local_e8,(ReturnAction *)&gtest_ar.message_);
      testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
                (pTVar5,&local_e8);
      testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_e8);
      testing::internal::ReturnAction<int>::~ReturnAction((ReturnAction<int> *)&gtest_ar.message_);
      testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_a8);
      testing::Matcher<unsigned_short>::~Matcher(&local_c0);
      n_e_s::core::test::CpuTest::step_execution(&this->super_CpuTest,'\x04');
      testing::internal::EqHelper::
      Compare<n_e_s::core::CpuRegisters,_n_e_s::core::CpuRegisters,_nullptr>
                ((EqHelper *)local_108,"expected","registers",&(this->super_CpuTest).expected,
                 &(this->super_CpuTest).registers);
      bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
      if (!bVar3) {
        testing::Message::Message(&local_110);
        message = testing::AssertionResult::failure_message((AssertionResult *)local_108);
        testing::internal::AssertHelper::AssertHelper
                  (&local_118,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                   ,0x248,message);
        testing::internal::AssertHelper::operator=(&local_118,&local_110);
        testing::internal::AssertHelper::~AssertHelper(&local_118);
        testing::Message::~Message(&local_110);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
      return;
    }
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

TEST_F(CpuTest, nop0c_abs) {
    stage_instruction(NOP_ABS0C);
    expected.pc += 2;
    EXPECT_CALL(mmu, read_byte(registers.pc + 1)).WillOnce(Return(0xCD));
    EXPECT_CALL(mmu, read_byte(registers.pc + 2)).WillOnce(Return(0xEF));

    step_execution(4);
    EXPECT_EQ(expected, registers);
}